

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addresstype.h
# Opt level: O2

bool operator<(WitnessUnknown *w1,WitnessUnknown *w2)

{
  long lVar1;
  __synth3way_t<unsigned_char> _Var2;
  bool bVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = true;
  if (w2->m_version <= w1->m_version) {
    if (w2->m_version < w1->m_version) {
      bVar3 = false;
    }
    else {
      _Var2 = std::operator<=><unsigned_char,std::allocator<unsigned_char>>
                        (&w1->m_program,&w2->m_program);
      bVar3 = (bool)((byte)_Var2._M_value >> 7);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool operator<(const WitnessUnknown& w1, const WitnessUnknown& w2) {
        if (w1.GetWitnessVersion() < w2.GetWitnessVersion()) return true;
        if (w1.GetWitnessVersion() > w2.GetWitnessVersion()) return false;
        return w1.GetWitnessProgram() < w2.GetWitnessProgram();
    }